

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ushort uVar3;
  int iVar4;
  short sVar5;
  char cVar6;
  BYTE *s;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  long *plVar10;
  short *psVar11;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  long *plVar19;
  char cVar20;
  short *psVar21;
  ulong uVar22;
  long *plVar23;
  long lVar24;
  short *psVar25;
  int iVar26;
  short *psVar27;
  long *plVar28;
  ulong *puVar29;
  char *pcVar30;
  int *piVar31;
  ulong *puVar32;
  LZ4_stream_t ctxBody;
  uint local_4050 [4096];
  uint local_50;
  undefined4 local_4c;
  uint local_38;
  
  iVar17 = 0;
  memset(local_4050,0,0x4020);
  local_50 = *srcSizePtr;
  uVar18 = (ulong)local_50;
  if (uVar18 < 0x7e000001) {
    iVar17 = (uint)(uVar18 * 0x8080808081 >> 0x27) + 0x10;
  }
  if (targetDstSize < iVar17) {
    iVar26 = (int)src;
    plVar19 = (long *)src;
    psVar11 = (short *)dst;
    local_38 = local_50;
    if ((int)local_50 < 0x1000b) {
      iVar17 = 0;
      if (local_50 < 0x7e000001) {
        iVar17 = 0;
        if (local_50 == 0) {
          if (0 < targetDstSize) {
            *dst = '\0';
            *srcSizePtr = 0;
            iVar17 = 1;
          }
        }
        else if (0 < targetDstSize) {
          psVar25 = (short *)(dst + targetDstSize);
          local_4c = 3;
          if (0xc < local_50) {
            *(undefined2 *)
             ((long)local_4050 + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
            puVar1 = (ulong *)(src + (uVar18 - 0xc));
LAB_001114db:
            iVar17 = *(int *)((long)plVar19 + 1);
            uVar15 = 0x40;
            uVar22 = 1;
            plVar8 = (long *)((long)plVar19 + 1);
            do {
              plVar28 = plVar8;
              plVar8 = (long *)(uVar22 + (long)plVar28);
              if (src + (uVar18 - 0xb) < plVar8) goto LAB_00111944;
              uVar22 = (ulong)(uVar15 >> 6);
              uVar15 = uVar15 + 1;
              uVar13 = (ulong)((uint)(iVar17 * -0x61c8864f) >> 0x13);
              uVar9 = (ulong)*(ushort *)((long)local_4050 + uVar13 * 2);
              sVar5 = (short)src;
              iVar17 = (int)*plVar8;
              *(short *)((long)local_4050 + uVar13 * 2) = (short)plVar28 - sVar5;
            } while (*(int *)(src + uVar9) != (int)*plVar28);
            iVar17 = (int)plVar28 - (int)plVar19;
            lVar7 = 0;
            cVar6 = (char)plVar28 * '\x10' + (char)plVar19 * -0x10;
            uVar15 = iVar17 - 0xfU;
            do {
              uVar16 = uVar15;
              cVar20 = cVar6;
              lVar24 = lVar7;
              pcVar30 = src + lVar24 + uVar9;
              if ((pcVar30 <= src) || ((long *)((long)plVar28 + lVar24) <= plVar19)) break;
              lVar7 = lVar24 + -1;
              cVar6 = cVar20 + -0x10;
              uVar15 = uVar16 - 1;
            } while (*(char *)((long)plVar28 + lVar24 + -1) == src[lVar24 + (uVar9 - 1)]);
            iVar14 = (int)lVar24;
            uVar22 = (ulong)(uint)(iVar14 + ((int)plVar28 - (int)plVar19));
            if ((short *)((long)psVar11 + uVar22 + (ulong)(iVar17 + iVar14 + 0xf0) / 0xff + 0xc) <=
                psVar25) {
              plVar8 = (long *)((long)psVar11 + 1);
              if ((uint)(iVar17 + iVar14) < 0xf) {
                *(char *)psVar11 = cVar20;
              }
              else {
                uVar9 = (ulong)(iVar17 - 0xfU) + lVar24;
                *(char *)psVar11 = -0x10;
                if (0xfe < (int)uVar9) {
                  uVar15 = 0x1fd;
                  if (uVar16 < 0x1fd) {
                    uVar15 = uVar16;
                  }
                  if (0x1fc < (int)uVar16) {
                    uVar16 = 0x1fd;
                  }
                  memset(plVar8,0xff,(ulong)((((iVar17 + 0xef) - uVar15) + iVar14) / 0xff + 1));
                  uVar15 = ((iVar17 + 0xef) - uVar16) + iVar14;
                  plVar8 = (long *)((long)psVar11 + (ulong)uVar15 / 0xff + 2);
                  uVar9 = (ulong)(iVar17 + -0x10e + iVar14 + uVar15 / 0xff);
                }
                *(char *)plVar8 = (char)uVar9;
                plVar8 = (long *)((long)plVar8 + 1);
              }
              plVar23 = (long *)(uVar22 + (long)plVar8);
              plVar10 = plVar19;
              do {
                *plVar8 = *plVar10;
                plVar8 = plVar8 + 1;
                plVar10 = plVar10 + 1;
              } while (plVar8 < plVar23);
              plVar8 = (long *)((long)plVar28 + lVar24);
              psVar21 = psVar11;
              if ((short *)((long)plVar23 + 0xb) <= psVar25) {
                do {
                  *(short *)plVar23 = (short)plVar8 - (short)pcVar30;
                  puVar2 = (ulong *)((long)plVar8 + 4);
                  puVar32 = (ulong *)(pcVar30 + 4);
                  puVar29 = puVar2;
                  if (puVar2 < puVar1) {
                    if (*puVar32 == *puVar2) {
                      puVar32 = (ulong *)(pcVar30 + 0xc);
                      puVar29 = (ulong *)((long)plVar8 + 0xc);
                      goto LAB_001116fc;
                    }
                    uVar22 = *puVar2 ^ *puVar32;
                    lVar7 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                      }
                    }
                    uVar15 = (uint)lVar7 >> 3;
                  }
                  else {
LAB_001116fc:
                    if (puVar29 < puVar1) {
                      iVar17 = ((int)puVar29 - (int)plVar8) + -4;
LAB_0011170c:
                      if (*puVar32 == *puVar29) goto code_r0x00111718;
                      uVar9 = *puVar29 ^ *puVar32;
                      uVar22 = 0;
                      if (uVar9 != 0) {
                        for (; (uVar9 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                        }
                      }
                      uVar15 = ((uint)(uVar22 >> 3) & 0x1fffffff) + iVar17;
                      goto LAB_00111793;
                    }
LAB_00111728:
                    if ((puVar29 < src + (uVar18 - 8)) && ((int)*puVar32 == (int)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 4);
                      puVar32 = (ulong *)((long)puVar32 + 4);
                    }
                    if ((puVar29 < src + (uVar18 - 6)) && ((short)*puVar32 == (short)*puVar29)) {
                      puVar29 = (ulong *)((long)puVar29 + 2);
                      puVar32 = (ulong *)((long)puVar32 + 2);
                    }
                    if (puVar29 < src + (uVar18 - 5)) {
                      puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar32 == (char)*puVar29))
                      ;
                    }
                    uVar15 = (int)puVar29 - (int)puVar2;
                  }
LAB_00111793:
                  psVar11 = (short *)((long)plVar23 + 2);
                  plVar19 = (long *)((long)plVar8 + (ulong)uVar15 + 4);
                  uVar16 = uVar15;
                  if (psVar25 < (short *)((long)plVar23 + (ulong)(uVar15 + 0xf0) / 0xff + 8)) {
                    uVar16 = ((int)psVar25 - (int)psVar11) * 0xff - 0x5ec;
                    plVar19 = (long *)((long)plVar19 - (ulong)(uVar15 - uVar16));
                    for (plVar8 = plVar19; plVar8 <= plVar28; plVar8 = (long *)((long)plVar8 + 1)) {
                      *(undefined2 *)
                       ((long)local_4050 + (ulong)((uint)((int)*plVar8 * -0x61c8864f) >> 0x13) * 2)
                           = 0;
                    }
                  }
                  if (uVar16 < 0xf) {
                    *(char *)psVar21 = (char)*psVar21 + (char)uVar16;
                  }
                  else {
                    *(char *)psVar21 = (char)*psVar21 + '\x0f';
                    uVar15 = uVar16 - 0xf;
                    psVar11[0] = -1;
                    psVar11[1] = -1;
                    if (0x3fb < uVar15) {
                      uVar22 = (ulong)(((uVar16 - 0x40b) / 0x3fc) * 4);
                      memset((char *)((long)plVar23 + 6),0xff,uVar22 + 4);
                      uVar15 = (uVar16 - 0x40b) % 0x3fc;
                      psVar11 = (short *)((long)plVar23 + uVar22 + 6);
                    }
                    uVar16 = (uVar15 & 0xffff) / 0xff;
                    pcVar30 = (char *)((long)psVar11 + (ulong)uVar16);
                    psVar11 = (short *)(pcVar30 + 1);
                    *pcVar30 = (char)uVar16 + (char)uVar15;
                  }
                  if (src + (uVar18 - 0xb) <= plVar19) break;
                  *(short *)((long)local_4050 +
                            (ulong)((uint)(*(int *)((long)plVar19 + -2) * -0x61c8864f) >> 0x13) * 2)
                       = ((short)plVar19 + -2) - sVar5;
                  uVar22 = (ulong)((uint)((int)*plVar19 * -0x61c8864f) >> 0x13);
                  uVar3 = *(ushort *)((long)local_4050 + uVar22 * 2);
                  pcVar30 = src + uVar3;
                  *(short *)((long)local_4050 + uVar22 * 2) = (short)plVar19 - sVar5;
                  if (*(int *)(src + uVar3) != (int)*plVar19) goto LAB_001114db;
                  plVar23 = (long *)((long)psVar11 + 1);
                  *(char *)psVar11 = '\0';
                  plVar8 = plVar19;
                  psVar21 = psVar11;
                  if (psVar25 < psVar11 + 6) break;
                } while( true );
              }
            }
          }
LAB_00111944:
          pcVar30 = src + (uVar18 - (long)plVar19);
          if (psVar25 < (short *)((long)psVar11 +
                                 (long)(pcVar30 + (ulong)(pcVar30 + 0xf0) / 0xff + 1))) {
            pcVar30 = (char *)((long)psVar25 +
                              (~(ulong)psVar11 -
                              ((ulong)((long)psVar25 + ~(ulong)psVar11 + 0xf1) >> 8)));
          }
          if (pcVar30 < (char *)0xf) {
            *(char *)psVar11 = (char)pcVar30 << 4;
          }
          else {
            pcVar12 = pcVar30 + -0xf;
            *(char *)psVar11 = -0x10;
            psVar25 = (short *)((long)psVar11 + 1);
            if ((char *)0xfe < pcVar12) {
              uVar18 = (ulong)(pcVar30 + -0x10e) / 0xff;
              memset(psVar25,0xff,uVar18 + 1);
              psVar25 = (short *)((long)psVar11 + uVar18 + 2);
              pcVar12 = pcVar30 + uVar18 * -0xff + -0x10e;
            }
            *(char *)psVar25 = (char)pcVar12;
            psVar11 = psVar25;
          }
          memcpy((char *)((long)psVar11 + 1),plVar19,(size_t)pcVar30);
          *srcSizePtr = ((int)plVar19 + (int)pcVar30) - iVar26;
          iVar17 = ((int)(char *)((long)psVar11 + 1) + (int)pcVar30) - (int)dst;
        }
      }
    }
    else {
      iVar17 = 0;
      if ((local_50 < 0x7e000001) && (0 < targetDstSize)) {
        plVar28 = (long *)(src + (uVar18 - 0xb));
        psVar25 = (short *)(dst + targetDstSize);
        local_4c = 2;
        local_4050[(ulong)(*(long *)src * -0x30e4432345000000) >> 0x34] = 0;
        plVar8 = (long *)(src + 2);
        puVar1 = (ulong *)(src + (uVar18 - 0xc));
LAB_00110f9b:
        lVar7 = *(long *)((long)plVar19 + 1);
        uVar22 = 1;
        plVar23 = (long *)((long)plVar19 + 1);
        uVar15 = 0x41;
        while( true ) {
          plVar10 = plVar8;
          uVar9 = (ulong)(lVar7 * -0x30e4432345000000) >> 0x34;
          uVar16 = local_4050[uVar9];
          uVar13 = (ulong)uVar16;
          iVar17 = (int)plVar23;
          lVar7 = *plVar10;
          local_4050[uVar9] = iVar17 - iVar26;
          if (((uint)(iVar17 - iVar26) <= uVar16 + 0xffff) &&
             (*(int *)(src + uVar13) == (int)*plVar23)) break;
          plVar8 = (long *)(uVar22 + (long)plVar10);
          uVar22 = (ulong)(uVar15 >> 6);
          plVar23 = plVar10;
          uVar15 = uVar15 + 1;
          if (plVar28 < plVar8) goto LAB_00111944;
        }
        iVar14 = iVar17 - (int)plVar19;
        lVar7 = 0;
        cVar6 = (char)plVar23 * '\x10' + (char)plVar19 * -0x10;
        uVar15 = iVar14 - 0xfU;
        do {
          uVar16 = uVar15;
          cVar20 = cVar6;
          lVar24 = lVar7;
          piVar31 = (int *)(src + lVar24 + uVar13);
          plVar8 = (long *)(lVar24 + (long)plVar23);
          if ((piVar31 <= src) || (plVar8 <= plVar19)) break;
          lVar7 = lVar24 + -1;
          cVar6 = cVar20 + -0x10;
          uVar15 = uVar16 - 1;
        } while (*(char *)((long)plVar23 + lVar24 + -1) == src[lVar24 + (uVar13 - 1)]);
        iVar4 = (int)lVar24;
        uVar22 = (ulong)(uint)((iVar17 - (int)plVar19) + iVar4);
        if ((short *)((long)psVar11 + uVar22 + (ulong)(iVar14 + iVar4 + 0xf0) / 0xff + 0xc) <=
            psVar25) {
          pcVar30 = (char *)((long)psVar11 + 1);
          if ((uint)(iVar14 + iVar4) < 0xf) {
            *(char *)psVar11 = cVar20;
          }
          else {
            uVar9 = (ulong)(iVar14 - 0xfU) + lVar24;
            *(char *)psVar11 = -0x10;
            if (0xfe < (int)uVar9) {
              uVar15 = 0x1fd;
              if (uVar16 < 0x1fd) {
                uVar15 = uVar16;
              }
              if (0x1fc < (int)uVar16) {
                uVar16 = 0x1fd;
              }
              memset(pcVar30,0xff,(ulong)((((iVar14 + 0xef) - uVar15) + iVar4) / 0xff + 1));
              uVar15 = ((iVar14 + 0xef) - uVar16) + iVar4;
              pcVar30 = (char *)((long)psVar11 + (ulong)uVar15 / 0xff + 2);
              uVar9 = (ulong)(iVar14 + -0x10e + iVar4 + uVar15 / 0xff);
            }
            *pcVar30 = (char)uVar9;
            pcVar30 = pcVar30 + 1;
          }
          psVar21 = (short *)(pcVar30 + uVar22);
          lVar7 = 0;
          do {
            pcVar12 = pcVar30 + lVar7;
            *(undefined8 *)pcVar12 = *(undefined8 *)((long)plVar19 + lVar7);
            lVar7 = lVar7 + 8;
          } while (pcVar12 + 8 < psVar21);
          psVar27 = psVar11;
          if ((short *)((long)psVar21 + 0xb) <= psVar25) {
            do {
              *psVar21 = (short)plVar8 - (short)piVar31;
              puVar2 = (ulong *)((long)plVar8 + 4);
              puVar32 = (ulong *)(piVar31 + 1);
              puVar29 = puVar2;
              if (puVar2 < puVar1) {
                if (*puVar32 == *puVar2) {
                  puVar32 = (ulong *)(piVar31 + 3);
                  puVar29 = (ulong *)((long)plVar8 + 0xc);
                  goto LAB_001111d6;
                }
                uVar22 = *puVar2 ^ *puVar32;
                lVar7 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                uVar15 = (uint)lVar7 >> 3;
              }
              else {
LAB_001111d6:
                if (puVar29 < puVar1) {
                  iVar17 = ((int)puVar29 - (int)plVar8) + -4;
LAB_001111e6:
                  if (*puVar32 == *puVar29) goto code_r0x001111f1;
                  uVar9 = *puVar29 ^ *puVar32;
                  uVar22 = 0;
                  if (uVar9 != 0) {
                    for (; (uVar9 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
                    }
                  }
                  uVar15 = ((uint)(uVar22 >> 3) & 0x1fffffff) + iVar17;
                  goto LAB_00111269;
                }
LAB_00111201:
                if ((puVar29 < src + (uVar18 - 8)) && ((int)*puVar32 == (int)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 4);
                  puVar32 = (ulong *)((long)puVar32 + 4);
                }
                if ((puVar29 < src + (uVar18 - 6)) && ((short)*puVar32 == (short)*puVar29)) {
                  puVar29 = (ulong *)((long)puVar29 + 2);
                  puVar32 = (ulong *)((long)puVar32 + 2);
                }
                if (puVar29 < src + (uVar18 - 5)) {
                  puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar32 == (char)*puVar29));
                }
                uVar15 = (int)puVar29 - (int)puVar2;
              }
LAB_00111269:
              psVar11 = psVar21 + 1;
              plVar19 = (long *)((long)plVar8 + (ulong)uVar15 + 4);
              uVar16 = uVar15;
              if (psVar25 < (short *)((long)psVar21 + (ulong)(uVar15 + 0xf0) / 0xff + 8)) {
                uVar16 = ((int)psVar25 - (int)psVar11) * 0xff - 0x5ec;
                plVar19 = (long *)((long)plVar19 - (ulong)(uVar15 - uVar16));
                for (plVar8 = plVar19; plVar8 <= plVar23; plVar8 = (long *)((long)plVar8 + 1)) {
                  local_4050[(ulong)(*plVar8 * -0x30e4432345000000) >> 0x34] = 0;
                }
              }
              if (uVar16 < 0xf) {
                *(char *)psVar27 = (char)*psVar27 + (char)uVar16;
              }
              else {
                *(char *)psVar27 = (char)*psVar27 + '\x0f';
                uVar15 = uVar16 - 0xf;
                psVar11[0] = -1;
                psVar11[1] = -1;
                if (0x3fb < uVar15) {
                  uVar22 = (ulong)(((uVar16 - 0x40b) / 0x3fc) * 4);
                  memset(psVar21 + 3,0xff,uVar22 + 4);
                  uVar15 = (uVar16 - 0x40b) % 0x3fc;
                  psVar11 = (short *)((long)psVar21 + uVar22 + 6);
                }
                uVar16 = (uVar15 & 0xffff) / 0xff;
                pcVar30 = (char *)((long)psVar11 + (ulong)uVar16);
                psVar11 = (short *)(pcVar30 + 1);
                *pcVar30 = (char)uVar16 + (char)uVar15;
              }
              if (plVar28 <= plVar19) break;
              local_4050[(ulong)(*(long *)((long)plVar19 + -2) * -0x30e4432345000000) >> 0x34] =
                   ((int)plVar19 + -2) - iVar26;
              uVar22 = (ulong)(*plVar19 * -0x30e4432345000000) >> 0x34;
              uVar16 = (int)plVar19 - iVar26;
              uVar15 = local_4050[uVar22];
              local_4050[uVar22] = uVar16;
              if ((uVar15 + 0xffff < uVar16) ||
                 (piVar31 = (int *)(src + uVar15), *piVar31 != (int)*plVar19)) goto LAB_00111439;
              psVar21 = (short *)((long)psVar11 + 1);
              *(char *)psVar11 = '\0';
              plVar8 = plVar19;
              psVar27 = psVar11;
              if (psVar25 < psVar11 + 6) break;
            } while( true );
          }
        }
        goto LAB_00111944;
      }
    }
  }
  else {
    iVar17 = LZ4_compress_fast_extState(local_4050,src,dst,local_50,targetDstSize,1);
  }
  return iVar17;
code_r0x001111f1:
  puVar29 = puVar29 + 1;
  puVar32 = puVar32 + 1;
  iVar17 = iVar17 + 8;
  if (puVar1 <= puVar29) goto LAB_00111201;
  goto LAB_001111e6;
LAB_00111439:
  plVar8 = (long *)((long)plVar19 + 2);
  if (plVar28 < plVar8) goto LAB_00111944;
  goto LAB_00110f9b;
code_r0x00111718:
  puVar29 = puVar29 + 1;
  puVar32 = puVar32 + 1;
  iVar17 = iVar17 + 8;
  if (puVar1 <= puVar29) goto LAB_00111728;
  goto LAB_0011170c;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}